

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

bool __thiscall DPlayerMenu::MenuEvent(DPlayerMenu *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint32 uVar4;
  FListMenuItem **ppFVar5;
  char *local_68;
  int local_5c;
  uint32 color_2;
  uint32 color_1;
  uint32 color;
  FName current;
  FListMenuItem *li;
  byte local_1d;
  int v;
  bool fromcontroller_local;
  DPlayerMenu *pDStack_18;
  int mkey_local;
  DPlayerMenu *this_local;
  
  local_1d = fromcontroller;
  v = mkey;
  pDStack_18 = this;
  if (-1 < ((this->super_DListMenu).mDesc)->mSelectedItem) {
    ppFVar5 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                        (&(((this->super_DListMenu).mDesc)->mItems).
                          super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                         (long)((this->super_DListMenu).mDesc)->mSelectedItem);
    _color = *ppFVar5;
    uVar2 = (*_color->_vptr_FListMenuItem[0xd])(_color,(ulong)(uint)v,(ulong)local_1d & 1);
    if ((uVar2 & 1) != 0) {
      (*_color->_vptr_FListMenuItem[7])((FName *)&color_1,_color,0);
      iVar3 = FName::operator_cast_to_int((FName *)&color_1);
      if (iVar3 == 5) {
        ClassChanged(this,_color);
      }
      else if (iVar3 == 0x1e4) {
        if (v == 10) {
          PlayerNameChanged(this,_color);
        }
      }
      else if (iVar3 == 0x1e5) {
        uVar2 = (*_color->_vptr_FListMenuItem[0xb])(_color,0,(long)&li + 4);
        if ((uVar2 & 1) != 0) {
          if (li._4_4_ == 0) {
            local_5c = 0xff;
          }
          else {
            local_5c = li._4_4_ + -1;
          }
          FIntCVar::operator=(&team,local_5c);
        }
      }
      else if (iVar3 == 0x1e6) {
        ColorSetChanged(this,_color);
      }
      else if (iVar3 == 0x1e7) {
        uVar2 = (*_color->_vptr_FListMenuItem[0xb])(_color,0,(long)&li + 4);
        if ((uVar2 & 1) != 0) {
          uVar4 = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
          SendNewColor(this,li._4_4_,uVar4 >> 8 & 0xff,uVar4 & 0xff);
        }
      }
      else if (iVar3 == 0x1e8) {
        uVar2 = (*_color->_vptr_FListMenuItem[0xb])(_color,0,(long)&li + 4);
        if ((uVar2 & 1) != 0) {
          uVar4 = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
          SendNewColor(this,uVar4 >> 0x10 & 0xff,li._4_4_,uVar4 & 0xff);
        }
      }
      else if (iVar3 == 0x1e9) {
        uVar2 = (*_color->_vptr_FListMenuItem[0xb])(_color,0,(long)&li + 4);
        if ((uVar2 & 1) != 0) {
          uVar4 = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
          SendNewColor(this,uVar4 >> 0x10 & 0xff,uVar4 >> 8 & 0xff,li._4_4_);
        }
      }
      else if (iVar3 == 0x1ea) {
        SkinChanged(this,_color);
      }
      else if (iVar3 == 0x1eb) {
        uVar2 = (*_color->_vptr_FListMenuItem[0xb])(_color,0,(long)&li + 4);
        if ((uVar2 & 1) != 0) {
          if (li._4_4_ == 0) {
            local_68 = "male";
          }
          else {
            local_68 = "other";
            if (li._4_4_ == 1) {
              local_68 = "female";
            }
          }
          cvar_set("gender",local_68);
        }
      }
      else if (iVar3 == 0x1ec) {
        AutoaimChanged(this,_color);
      }
      else if (iVar3 == 0x1ed) {
        uVar2 = (*_color->_vptr_FListMenuItem[0xb])(_color,0,(long)&li + 4);
        if ((uVar2 & 1) != 0) {
          FBoolCVar::operator=(&neverswitchonpickup,li._4_4_ != 0);
        }
      }
      else if ((iVar3 == 0x20f) &&
              (uVar2 = (*_color->_vptr_FListMenuItem[0xb])(_color,0,(long)&li + 4), (uVar2 & 1) != 0
              )) {
        FBoolCVar::operator=(&cl_run,li._4_4_ != 0);
      }
      return true;
    }
  }
  bVar1 = DListMenu::MenuEvent(&this->super_DListMenu,v,(bool)(local_1d & 1));
  return bVar1;
}

Assistant:

bool DPlayerMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int v;
	if (mDesc->mSelectedItem >= 0)
	{
		FListMenuItem *li = mDesc->mItems[mDesc->mSelectedItem];
		if (li->MenuEvent(mkey, fromcontroller))
		{
			FName current = li->GetAction(NULL);
			switch(current)
			{
				// item specific handling comes here

			case NAME_Playerbox:
				if (mkey == MKEY_Input)
				{
					PlayerNameChanged(li);
				}
				break;

			case NAME_Team:
				if (li->GetValue(0, &v))
				{
					team = v==0? TEAM_NONE : v-1;
				}
				break;

			case NAME_Color:
					ColorSetChanged(li);
					break;

			case NAME_Red:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (v, GPART(color), BPART(color));
				}
				break;

			case NAME_Green:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), v, BPART(color));
				}
				break;

			case NAME_Blue:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), GPART(color), v);
				}
				break;

			case NAME_Class:
				ClassChanged(li);
				break;

			case NAME_Skin:
				SkinChanged(li);
				break;

			case NAME_Gender:
				if (li->GetValue(0, &v))
				{
					cvar_set ("gender", v==0? "male" : v==1? "female" : "other");
				}
				break;

			case NAME_Autoaim:
				AutoaimChanged(li);
				break;

			case NAME_Switch:
				if (li->GetValue(0, &v))
				{
					neverswitchonpickup = !!v;
				}
				break;

			case NAME_AlwaysRun:
				if (li->GetValue(0, &v))
				{
					cl_run = !!v;
				}
				break;

			default:
				break;
			}
			return true;
		}
	}
	return Super::MenuEvent(mkey, fromcontroller);
}